

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O2

void __thiscall
slang::ast::ConditionalStatement::visitExprs<slang::ast::CheckerMemberVisitor&>
          (ConditionalStatement *this,CheckerMemberVisitor *visitor)

{
  Condition *cond;
  pointer pCVar1;
  long lVar2;
  
  pCVar1 = (this->conditions)._M_ptr;
  for (lVar2 = (this->conditions)._M_extent._M_extent_value << 4; lVar2 != 0; lVar2 = lVar2 + -0x10)
  {
    Expression::visit<slang::ast::CheckerMemberVisitor&>((pCVar1->expr).ptr,visitor);
    if (pCVar1->pattern != (Pattern *)0x0) {
      Pattern::visit<slang::ast::CheckerMemberVisitor>(pCVar1->pattern,visitor);
    }
    pCVar1 = pCVar1 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions) {
            cond.expr->visit(visitor);
            if (cond.pattern)
                cond.pattern->visit(visitor);
        }
    }